

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fnv.hpp
# Opt level: O2

uint64_t __thiscall
pstore::fnv_64a_hash::operator()(fnv_64a_hash *this,sstring_view<const_char_*> *c)

{
  uint64_t uVar1;
  span<const_char,__1L> sVar2;
  span<const_char,__1L> buf;
  
  sVar2 = gsl::make_span<pstore::sstring_view<char_const*>>(c);
  buf.storage_.data_ = (pointer)0xcbf29ce484222325;
  buf.storage_.super_extent_type<_1L>.size_ = (index_type)sVar2.storage_.data_;
  uVar1 = fnv_64a_buf<char_const,_1l>
                    ((pstore *)sVar2.storage_.super_extent_type<_1L>.size_.size_,buf,
                     0xcbf29ce484222325);
  return uVar1;
}

Assistant:

std::uint64_t operator() (Container const & c) const {
            return fnv_64a_buf (gsl::make_span (c));
        }